

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

bool __thiscall
__gnu_cxx::__ops::_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::$_0>::
operator()(_Iter_pred<cmState::IsCacheEntryType(std::__cxx11::string_const&)::__0> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__it)

{
  size_t __n;
  int iVar1;
  
  __n = (*(undefined8 **)this)[1];
  if (__n != __it->_M_string_length) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp((void *)**(undefined8 **)this,(__it->_M_dataplus)._M_p,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

bool cmState::LoadCache(const std::string& path, bool internal,
                        std::set<std::string>& excludes,
                        std::set<std::string>& includes)
{
  return this->CacheManager->LoadCache(path, internal, excludes, includes);
}